

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMakeArray
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Type TVar1;
  const_reference pvVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 uVar5;
  size_type sVar6;
  Interpreter *pIVar7;
  mapped_type *ppHVar8;
  reference ppHVar9;
  Interpreter *in_RDX;
  Interpreter *in_RDI;
  Value VVar10;
  HeapThunk *el;
  HeapThunk *th;
  long i;
  stringstream ss_1;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  elements;
  HeapClosure *func;
  stringstream ss;
  long sz;
  Frame *f;
  string *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  Interpreter *in_stack_fffffffffffffaf8;
  HeapThunk *in_stack_fffffffffffffb00;
  size_type in_stack_fffffffffffffb08;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_fffffffffffffb10;
  allocator_type *in_stack_fffffffffffffb18;
  allocator<char> *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  HeapThunk *this_00;
  AST **in_stack_fffffffffffffb50;
  uint *in_stack_fffffffffffffb58;
  HeapObject **in_stack_fffffffffffffb60;
  Identifier **in_stack_fffffffffffffb68;
  Interpreter *this_01;
  undefined4 uStack_464;
  size_type local_420;
  stringstream local_3f0 [16];
  ostream local_3e0 [376];
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  local_268;
  HeapEntity *local_250;
  undefined1 local_241;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffdd0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  LocationRange *in_stack_fffffffffffffde8;
  Interpreter *in_stack_fffffffffffffdf0;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 *local_80;
  undefined8 local_78;
  allocator<char> local_41;
  string local_40 [32];
  Frame *local_20;
  Interpreter *local_18;
  
  local_18 = in_RDX;
  local_20 = Stack::top((Stack *)0x222d08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb30,
             (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20);
  local_88 = 2;
  local_84 = 0x11;
  local_80 = &local_88;
  local_78 = 2;
  this_01 = local_18;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x222daa);
  __l._M_array._4_4_ = in_stack_fffffffffffffb2c;
  __l._M_array._0_4_ = in_stack_fffffffffffffb28;
  __l._M_len = (size_type)in_stack_fffffffffffffb30;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffffb20,__l,in_stack_fffffffffffffb18);
  validateBuiltinArgs(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                      in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_stack_fffffffffffffb00);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x222e1a);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,0);
  lVar3 = (long)(pvVar2->v).d;
  if (lVar3 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde0);
    poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffdf0,
                             "makeArray requires size >= 0, got ");
    std::ostream::operator<<(poVar4,lVar3);
    local_241 = 1;
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(in_stack_fffffffffffffaf8,
              (LocationRange *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
              in_stack_fffffffffffffae8);
    local_241 = 0;
    __cxa_throw(uVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,1);
  local_250 = (pvVar2->v).h;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)0x223040);
  sVar6 = std::
          vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                  *)(local_250 + 5));
  if (sVar6 != 1) {
    std::__cxx11::stringstream::stringstream(local_3f0);
    poVar4 = std::operator<<(local_3e0,"makeArray function must take 1 param, got: ");
    sVar6 = std::
            vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
            ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                    *)(local_250 + 5));
    std::ostream::operator<<(poVar4,sVar6);
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(in_stack_fffffffffffffaf8,
              (LocationRange *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
              in_stack_fffffffffffffae8);
    __cxa_throw(uVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::resize(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  for (local_420 = 0; (long)local_420 < lVar3; local_420 = local_420 + 1) {
    pIVar7 = (Interpreter *)
             (anonymous_namespace)::Interpreter::
             makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,jsonnet::internal::(anonymous_namespace)::HeapObject*const&,unsigned_int_const&,jsonnet::internal::AST_const*const&>
                       (this_01,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                        in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)in_stack_fffffffffffffb00,(value_type *)in_stack_fffffffffffffaf8);
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::operator=((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 *)in_stack_fffffffffffffae8);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                  *)(local_250 + 5),0);
    in_stack_fffffffffffffb00 =
         (anonymous_namespace)::Interpreter::
         makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*const&,decltype(nullptr),int,decltype(nullptr)>
                   (this_01,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                    (int *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    this_00 = in_stack_fffffffffffffb00;
    VVar10 = makeNumber(in_RDI,(double)(long)local_420);
    TVar1 = VVar10.t;
    HeapThunk::fill((HeapThunk *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                    (Value *)in_stack_fffffffffffffae8);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                  *)(local_250 + 5),0);
    ppHVar8 = std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                            *)this_00,(key_type *)CONCAT44(TVar1,in_stack_fffffffffffffb28));
    *ppHVar8 = in_stack_fffffffffffffb00;
    ppHVar9 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::operator[](&local_268,local_420);
    *ppHVar9 = (value_type)pIVar7;
    in_stack_fffffffffffffaf8 = pIVar7;
  }
  VVar10 = makeArray((Interpreter *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                     (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                      *)in_stack_fffffffffffffae8);
  *(ulong *)&in_RDI->scratch = CONCAT44(uStack_464,VVar10.t);
  (in_RDI->scratch).v = VVar10.v;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)in_stack_fffffffffffffb00);
  return (AST *)0x0;
}

Assistant:

const AST *builtinMakeArray(const LocationRange &loc, const std::vector<Value> &args)
    {
        Frame &f = stack.top();
        validateBuiltinArgs(loc, "makeArray", args, {Value::NUMBER, Value::FUNCTION});
        long sz = long(args[0].v.d);
        if (sz < 0) {
            std::stringstream ss;
            ss << "makeArray requires size >= 0, got " << sz;
            throw makeError(loc, ss.str());
        }
        auto *func = static_cast<const HeapClosure *>(args[1].v.h);
        std::vector<HeapThunk *> elements;
        if (func->params.size() != 1) {
            std::stringstream ss;
            ss << "makeArray function must take 1 param, got: " << func->params.size();
            throw makeError(loc, ss.str());
        }
        elements.resize(sz);
        for (long i = 0; i < sz; ++i) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, func->self, func->offset, func->body);
            // The next line stops the new thunks from being GCed.
            f.thunks.push_back(th);
            th->upValues = func->upValues;

            auto *el = makeHeap<HeapThunk>(func->params[0].id, nullptr, 0, nullptr);
            el->fill(makeNumber(i));  // i guaranteed not to be inf/NaN
            th->upValues[func->params[0].id] = el;
            elements[i] = th;
        }
        scratch = makeArray(elements);
        return nullptr;
    }